

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::TransformFeedback::TransformFeedbackCase::iterate
          (TransformFeedbackCase *this)

{
  DrawCall *end;
  ostringstream *this_00;
  TestLog *log;
  bool bVar1;
  bool bVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  int iVar5;
  MessageBuilder *this_01;
  uint seed;
  allocator<char> local_289;
  int numIterations;
  deUint32 local_284;
  DrawCall *local_280;
  ScopedLogSection section;
  string sectionDesc;
  int local_234;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  string local_1f0;
  string sectionName;
  undefined1 local_1b0 [384];
  
  if (iterate()::s_elemCount1 == '\0') {
    iVar5 = __cxa_guard_acquire(&iterate()::s_elemCount1);
    if (iVar5 != 0) {
      iterate::s_elemCount1[0].numElements = 1;
      iterate::s_elemCount1[0].transformFeedbackEnabled = true;
      __cxa_guard_release(&iterate()::s_elemCount1);
    }
  }
  if (iterate()::s_elemCount2 == '\0') {
    iVar5 = __cxa_guard_acquire(&iterate()::s_elemCount2);
    if (iVar5 != 0) {
      iterate::s_elemCount2[0].numElements = 2;
      iterate::s_elemCount2[0].transformFeedbackEnabled = true;
      __cxa_guard_release(&iterate()::s_elemCount2);
    }
  }
  if (iterate()::s_elemCount3 == '\0') {
    iVar5 = __cxa_guard_acquire(&iterate()::s_elemCount3);
    if (iVar5 != 0) {
      iterate::s_elemCount3[0].numElements = 3;
      iterate::s_elemCount3[0].transformFeedbackEnabled = true;
      __cxa_guard_release(&iterate()::s_elemCount3);
    }
  }
  if (iterate()::s_elemCount4 == '\0') {
    iVar5 = __cxa_guard_acquire(&iterate()::s_elemCount4);
    if (iVar5 != 0) {
      iterate::s_elemCount4[0].numElements = 4;
      iterate::s_elemCount4[0].transformFeedbackEnabled = true;
      __cxa_guard_release(&iterate()::s_elemCount4);
    }
  }
  if (iterate()::s_elemCount123 == '\0') {
    iVar5 = __cxa_guard_acquire(&iterate()::s_elemCount123);
    if (iVar5 != 0) {
      iterate::s_elemCount123[0].numElements = 0x7b;
      iterate::s_elemCount123[0].transformFeedbackEnabled = true;
      __cxa_guard_release(&iterate()::s_elemCount123);
    }
  }
  if (iterate()::s_basicPause1 == '\0') {
    iVar5 = __cxa_guard_acquire(&iterate()::s_basicPause1);
    if (iVar5 != 0) {
      iterate::s_basicPause1[0].numElements = 0x40;
      iterate::s_basicPause1[0].transformFeedbackEnabled = true;
      iterate::s_basicPause1[1].transformFeedbackEnabled = false;
      iterate::s_basicPause1[2].transformFeedbackEnabled = true;
      iterate::s_basicPause1[1].numElements = iterate::s_basicPause1[0].numElements;
      iterate::s_basicPause1[2].numElements = iterate::s_basicPause1[0].numElements;
      __cxa_guard_release(&iterate()::s_basicPause1);
    }
  }
  if (iterate()::s_basicPause2 == '\0') {
    iVar5 = __cxa_guard_acquire(&iterate()::s_basicPause2);
    if (iVar5 != 0) {
      iterate::s_basicPause2[0].numElements = 0xd;
      iterate::s_basicPause2[0].transformFeedbackEnabled = true;
      iterate::s_basicPause2[1].numElements = 5;
      iterate::s_basicPause2[1].transformFeedbackEnabled = true;
      iterate::s_basicPause2[2].numElements = 0x11;
      iterate::s_basicPause2[2].transformFeedbackEnabled = false;
      iterate::s_basicPause2[3].numElements = 3;
      iterate::s_basicPause2[3].transformFeedbackEnabled = true;
      iterate::s_basicPause2[4].numElements = 7;
      iterate::s_basicPause2[4].transformFeedbackEnabled = false;
      __cxa_guard_release(&iterate()::s_basicPause2);
    }
  }
  if (iterate()::s_startPaused == '\0') {
    iVar5 = __cxa_guard_acquire(&iterate()::s_startPaused);
    if (iVar5 != 0) {
      iterate::s_startPaused[0].numElements = 0x7b;
      iterate::s_startPaused[0].transformFeedbackEnabled = false;
      iterate::s_startPaused[1].transformFeedbackEnabled = true;
      iterate::s_startPaused[1].numElements = iterate::s_startPaused[0].numElements;
      __cxa_guard_release(&iterate()::s_startPaused);
    }
  }
  if (iterate()::s_random1 == '\0') {
    iVar5 = __cxa_guard_acquire(&iterate()::s_random1);
    if (iVar5 != 0) {
      iterate::s_random1[0].numElements = 0x41;
      iterate::s_random1[0].transformFeedbackEnabled = true;
      iterate::s_random1[1].numElements = 0x87;
      iterate::s_random1[1].transformFeedbackEnabled = false;
      iterate::s_random1[2].numElements = 0x4a;
      iterate::s_random1[2].transformFeedbackEnabled = true;
      iterate::s_random1[3].numElements = 0x10;
      iterate::s_random1[3].transformFeedbackEnabled = false;
      iterate::s_random1[4].numElements = 0xe2;
      iterate::s_random1[4].transformFeedbackEnabled = false;
      iterate::s_random1[5].numElements = 9;
      iterate::s_random1[5].transformFeedbackEnabled = true;
      iterate::s_random1[6].numElements = 0xae;
      iterate::s_random1[6].transformFeedbackEnabled = false;
      __cxa_guard_release(&iterate()::s_random1);
    }
  }
  if (iterate()::s_random2 == '\0') {
    iVar5 = __cxa_guard_acquire(&iterate()::s_random2);
    if (iVar5 != 0) {
      iterate::s_random2[0].numElements = 0xd9;
      iterate::s_random2[0].transformFeedbackEnabled = true;
      iterate::s_random2[1].numElements = 0xab;
      iterate::s_random2[1].transformFeedbackEnabled = true;
      iterate::s_random2[2].numElements = 0x93;
      iterate::s_random2[2].transformFeedbackEnabled = true;
      iterate::s_random2[3].numElements = 0x98;
      iterate::s_random2[3].transformFeedbackEnabled = false;
      iterate::s_random2[4].numElements = 0x37;
      iterate::s_random2[4].transformFeedbackEnabled = true;
      __cxa_guard_release(&iterate()::s_random2);
    }
  }
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  dVar3 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  iVar5 = this->m_iterNdx;
  dVar4 = ::deInt32Hash(iVar5);
  numIterations = 10;
  local_280 = iterate::s_iterations[iVar5].calls;
  iVar5 = iterate::s_iterations[iVar5].numCalls;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,"Iteration",(allocator<char> *)&section);
  local_230._M_dataplus._M_p._0_4_ = this->m_iterNdx + 1;
  de::toString<int>(&sectionDesc,(int *)&local_230);
  std::operator+(&sectionName,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                 &sectionDesc);
  std::__cxx11::string::~string((string *)&sectionDesc);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&section,"Iteration ",&local_289);
  local_234 = this->m_iterNdx + 1;
  de::toString<int>(&local_1f0,&local_234);
  std::operator+(&local_230,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                 &local_1f0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                 &local_230," / ");
  de::toString<int>(&local_210,&numIterations);
  local_284 = dVar3;
  std::operator+(&sectionDesc,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                 &local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&section);
  tcu::ScopedLogSection::ScopedLogSection(&section,log,&sectionName,&sectionDesc);
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Testing ");
  this_01 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,&iterate::s_iterations[this->m_iterNdx].numCalls)
  ;
  std::operator<<(&(this_01->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  " draw calls, (element count, TF state): ");
  end = local_280 + iVar5;
  local_230._M_dataplus._M_p = (pointer)local_280;
  local_230._M_string_length = (size_type)end;
  tcu::Format::operator<<
            (&(this_01->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
             (Array<const_deqp::gles3::Functional::TransformFeedback::DrawCall_*> *)&local_230);
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  seed = dVar4 ^ local_284;
  std::__cxx11::ostringstream::~ostringstream(this_00);
  bVar2 = runTest(this,local_280,end,seed);
  if (!bVar2) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Result comparison failed");
  }
  iVar5 = this->m_iterNdx + 1;
  this->m_iterNdx = iVar5;
  bVar1 = iVar5 < numIterations;
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  std::__cxx11::string::~string((string *)&sectionDesc);
  std::__cxx11::string::~string((string *)&sectionName);
  return (uint)(bVar2 && bVar1);
}

Assistant:

TransformFeedbackCase::IterateResult TransformFeedbackCase::iterate (void)
{
	// Test cases.
	static const DrawCall s_elemCount1[]	= { DrawCall(1, true) };
	static const DrawCall s_elemCount2[]	= { DrawCall(2, true) };
	static const DrawCall s_elemCount3[]	= { DrawCall(3, true) };
	static const DrawCall s_elemCount4[]	= { DrawCall(4, true) };
	static const DrawCall s_elemCount123[]	= { DrawCall(123, true) };
	static const DrawCall s_basicPause1[]	= { DrawCall(64, true), DrawCall(64, false), DrawCall(64, true) };
	static const DrawCall s_basicPause2[]	= { DrawCall(13, true), DrawCall(5, true), DrawCall(17, false), DrawCall(3, true), DrawCall(7, false) };
	static const DrawCall s_startPaused[]	= { DrawCall(123, false), DrawCall(123, true) };
	static const DrawCall s_random1[]		= { DrawCall(65, true), DrawCall(135, false), DrawCall(74, true), DrawCall(16, false), DrawCall(226, false), DrawCall(9, true), DrawCall(174, false) };
	static const DrawCall s_random2[]		= { DrawCall(217, true), DrawCall(171, true), DrawCall(147, true), DrawCall(152, false), DrawCall(55, true) };

	static const struct
	{
		const DrawCall*		calls;
		int					numCalls;
	} s_iterations[] =
	{
#define ITER(ARR) { ARR, DE_LENGTH_OF_ARRAY(ARR) }
		ITER(s_elemCount1),
		ITER(s_elemCount2),
		ITER(s_elemCount3),
		ITER(s_elemCount4),
		ITER(s_elemCount123),
		ITER(s_basicPause1),
		ITER(s_basicPause2),
		ITER(s_startPaused),
		ITER(s_random1),
		ITER(s_random2)
#undef ITER
	};

	TestLog&				log				= m_testCtx.getLog();
	bool					isOk			= true;
	deUint32				seed			= deStringHash(getName()) ^ deInt32Hash(m_iterNdx);
	int						numIterations	= DE_LENGTH_OF_ARRAY(s_iterations);
	const DrawCall*			first			= s_iterations[m_iterNdx].calls;
	const DrawCall*			end				= s_iterations[m_iterNdx].calls + s_iterations[m_iterNdx].numCalls;

	std::string				sectionName		= std::string("Iteration") + de::toString(m_iterNdx+1);
	std::string				sectionDesc		= std::string("Iteration ") + de::toString(m_iterNdx+1) + " / " + de::toString(numIterations);
	tcu::ScopedLogSection	section			(log, sectionName, sectionDesc);

	log << TestLog::Message << "Testing " << s_iterations[m_iterNdx].numCalls << " draw calls, (element count, TF state): " << tcu::formatArray(first, end) << TestLog::EndMessage;

	isOk = runTest(first, end, seed);

	if (!isOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Result comparison failed");

	m_iterNdx += 1;
	return (isOk && m_iterNdx < numIterations) ? CONTINUE : STOP;
}